

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9CompileLiteral(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  sxu32 nKeyLen;
  SyToken *pVal;
  char *zLeft;
  void *pvVar1;
  sxi32 sVar2;
  undefined8 in_RAX;
  uchar *zSrc;
  SyHashEntry_Pr *pSVar3;
  jx9_value *pjVar4;
  GenBlock *pGVar5;
  sxu32 sVar6;
  anon_union_8_3_18420de5_for_x aVar7;
  jx9_vm *pjVar8;
  sxu32 nIdx;
  undefined8 uStack_28;
  
  pVal = pGen->pIn;
  sVar6 = (pVal->sData).nByte;
  uStack_28 = in_RAX;
  switch(sVar6) {
  case 4:
    zLeft = (pVal->sData).zString;
    sVar2 = SyStrnicmp(zLeft,"null",4);
    if (sVar2 == 0) {
LAB_00129541:
      pjVar8 = pGen->pVm;
      sVar2 = 0;
      sVar6 = 0;
      goto LAB_00129589;
    }
    sVar2 = SyStrnicmp(zLeft,"true",4);
    if (sVar2 == 0) {
      pjVar8 = pGen->pVm;
      sVar2 = 0;
      sVar6 = 1;
      goto LAB_00129589;
    }
    break;
  case 5:
    sVar2 = SyStrnicmp((pVal->sData).zString,"false",5);
    if (sVar2 == 0) {
      pjVar8 = pGen->pVm;
      sVar2 = 0;
      sVar6 = 2;
      goto LAB_00129589;
    }
    break;
  case 8:
    sVar2 = SyMemcmp((pVal->sData).zString,"__LINE__",8);
    if (sVar2 == 0) {
      pjVar4 = jx9VmReserveConstObj(pGen->pVm,(sxu32 *)((long)&uStack_28 + 4));
      if (pjVar4 != (jx9_value *)0x0) {
        pjVar8 = pGen->pVm;
        aVar7.iVal._4_4_ = 0;
        aVar7.iVal._0_4_ = pVal->nLine;
        *(undefined8 *)&pjVar4->field_0xc = 0;
        *(undefined8 *)((long)&pjVar4->pVm + 4) = 0;
        (pjVar4->sBlob).mByte = 0;
        (pjVar4->sBlob).nFlags = 0;
        *(undefined8 *)&(pjVar4->sBlob).field_0x1c = 0;
        *(undefined8 *)((long)&(pjVar4->sBlob).pAllocator + 4) = 0;
        *(undefined8 *)((long)&(pjVar4->sBlob).pBlob + 4) = 0;
        *(undefined4 *)&pjVar4->field_0x3c = 0;
        pjVar4->pVm = pjVar8;
        (pjVar4->sBlob).pBlob = (void *)0x0;
        (pjVar4->sBlob).nByte = 0;
        (pjVar4->sBlob).mByte = 0;
        (pjVar4->sBlob).pAllocator = &pjVar8->sAllocator;
        pjVar4->x = aVar7;
        pjVar4->iFlags = 2;
LAB_00129579:
        pjVar8 = pGen->pVm;
        sVar2 = 0;
        sVar6 = uStack_28._4_4_;
        goto LAB_00129589;
      }
      goto LAB_00129596;
    }
    break;
  case 0xc:
    sVar2 = SyMemcmp((pVal->sData).zString,"__FUNCTION__",0xc);
    if (sVar2 == 0) {
      for (pGVar5 = pGen->pCurrent; pGVar5 != (GenBlock *)0x0; pGVar5 = pGVar5->pParent) {
        if ((pGVar5->iFlags & 8) != 0) {
          pvVar1 = pGVar5->pUserData;
          pjVar4 = jx9VmReserveConstObj(pGen->pVm,(sxu32 *)((long)&uStack_28 + 4));
          if (pjVar4 == (jx9_value *)0x0) goto LAB_00129596;
          jx9MemObjInitFromString(pGen->pVm,pjVar4,(SyString *)((long)pvVar1 + 0x50));
          goto LAB_00129579;
        }
      }
      goto LAB_00129541;
    }
  }
  if (((sVar6 == 0) || ((pGen->hLiteral).nEntry == 0)) ||
     (pSVar3 = HashGetEntry(&pGen->hLiteral,(pVal->sData).zString,sVar6),
     pSVar3 == (SyHashEntry_Pr *)0x0)) {
    pjVar4 = jx9VmReserveConstObj(pGen->pVm,(sxu32 *)((long)&uStack_28 + 4));
    if (pjVar4 == (jx9_value *)0x0) {
LAB_00129596:
      jx9GenCompileError(pGen,1,1,"Fatal, Jx9 compiler is running out of memory");
      return -10;
    }
    jx9MemObjInitFromString(pGen->pVm,pjVar4,&pVal->sData);
    nKeyLen = (pjVar4->sBlob).nByte;
    sVar6 = uStack_28._4_4_;
    if (nKeyLen != 0) {
      SyHashInsert(&pGen->hLiteral,(pjVar4->sBlob).pBlob,nKeyLen,(void *)(ulong)uStack_28._4_4_);
      sVar6 = uStack_28._4_4_;
    }
  }
  else {
    uStack_28 = CONCAT44(*(sxu32 *)&pSVar3->pUserData,(undefined4)uStack_28);
    sVar6 = *(sxu32 *)&pSVar3->pUserData;
  }
  pjVar8 = pGen->pVm;
  sVar2 = 1;
LAB_00129589:
  jx9VmEmitInstr(pjVar8,4,sVar2,sVar6,(void *)0x0,(sxu32 *)0x0);
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileLiteral(jx9_gen_state *pGen,sxi32 iCompileFlag)
{
	SyToken *pToken = pGen->pIn;
	jx9_value *pObj;
	SyString *pStr;	
	sxu32 nIdx;
	/* Extract token value */
	pStr = &pToken->sData;
	/* Deal with the reserved literals [i.e: null, false, true, ...] first */
	if( pStr->nByte == sizeof("NULL") - 1 ){
		if( SyStrnicmp(pStr->zString, "null", sizeof("NULL")-1) == 0 ){
			/* NULL constant are always indexed at 0 */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 0, 0, 0);
			return SXRET_OK;
		}else if( SyStrnicmp(pStr->zString, "true", sizeof("TRUE")-1) == 0 ){
			/* TRUE constant are always indexed at 1 */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 1, 0, 0);
			return SXRET_OK;
		}
	}else if (pStr->nByte == sizeof("FALSE") - 1 &&
		SyStrnicmp(pStr->zString, "false", sizeof("FALSE")-1) == 0 ){
			/* FALSE constant are always indexed at 2 */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 2, 0, 0);
			return SXRET_OK;
	}else if(pStr->nByte == sizeof("__LINE__") - 1 &&
		SyMemcmp(pStr->zString, "__LINE__", sizeof("__LINE__")-1) == 0 ){
			/* TICKET 1433-004: __LINE__ constant must be resolved at compile time, not run time */
			pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
			if( pObj == 0 ){
				SXUNUSED(iCompileFlag); /* cc warning */
				return GenStateOutOfMem(pGen);
			}
			jx9MemObjInitFromInt(pGen->pVm, pObj, pToken->nLine);
			/* Emit the load constant instruction */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
			return SXRET_OK;
	}else if( pStr->nByte == sizeof("__FUNCTION__") - 1 &&
		SyMemcmp(pStr->zString, "__FUNCTION__", sizeof("__FUNCTION__")-1) == 0 ){
			GenBlock *pBlock = pGen->pCurrent;
			/* TICKET 1433-004: __FUNCTION__/__METHOD__ constants must be resolved at compile time, not run time */
			while( pBlock && (pBlock->iFlags & GEN_BLOCK_FUNC) == 0 ){
				/* Point to the upper block */
				pBlock = pBlock->pParent;
			}
			if( pBlock == 0 ){
				/* Called in the global scope, load NULL */
				jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 0, 0, 0);
			}else{
				/* Extract the target function/method */
				jx9_vm_func *pFunc = (jx9_vm_func *)pBlock->pUserData;
				pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
				if( pObj == 0 ){
					return GenStateOutOfMem(pGen);
				}
				jx9MemObjInitFromString(pGen->pVm, pObj, &pFunc->sName);
				/* Emit the load constant instruction */
				jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
			}
			return SXRET_OK;
	}
	/* Query literal table */
	if( SXRET_OK != GenStateFindLiteral(&(*pGen), &pToken->sData, &nIdx) ){
		jx9_value *pObj;
		/* Unknown literal, install it in the literal table */
		pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
		if( pObj == 0 ){
			return GenStateOutOfMem(pGen);
		}
		jx9MemObjInitFromString(pGen->pVm, pObj, &pToken->sData);
		GenStateInstallLiteral(&(*pGen), pObj, nIdx);
	}
	/* Emit the load constant instruction */
	jx9VmEmitInstr(pGen->pVm,JX9_OP_LOADC,1,nIdx, 0, 0);
	/* Node successfully compiled */
	return SXRET_OK;
}